

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# readmtm.c
# Opt level: O0

int it_mtm_read_sample_data(IT_SAMPLE *sample,DUMBFILE *f)

{
  int iVar1;
  void *pvVar2;
  DUMBFILE *in_RSI;
  long in_RDI;
  int32 truncated_size;
  int32 i;
  undefined4 in_stack_ffffffffffffffe4;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  if (((*(byte *)(in_RDI + 0x32) & 0x10) == 0) ||
     (*(int *)(in_RDI + 0x38) <= *(int *)(in_RDI + 0x40))) {
    iVar1 = 0;
  }
  else {
    iVar1 = *(int *)(in_RDI + 0x38) - *(int *)(in_RDI + 0x40);
    *(undefined4 *)(in_RDI + 0x38) = *(undefined4 *)(in_RDI + 0x40);
  }
  pvVar2 = malloc((long)*(int *)(in_RDI + 0x38));
  *(void **)(in_RDI + 0x58) = pvVar2;
  if (*(long *)(in_RDI + 0x58) == 0) {
    iVar1 = -1;
  }
  else {
    dumbfile_getnc((char *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                   (int32)((ulong)in_RDI >> 0x20),in_RSI);
    dumbfile_skip(in_RSI,CONCAT44(in_stack_ffffffffffffffe4,iVar1));
    iVar1 = dumbfile_error(in_RSI);
    if (iVar1 == 0) {
      for (iVar1 = 0; iVar1 < *(int *)(in_RDI + 0x38); iVar1 = iVar1 + 1) {
        *(byte *)(*(long *)(in_RDI + 0x58) + (long)iVar1) =
             *(byte *)(*(long *)(in_RDI + 0x58) + (long)iVar1) ^ 0x80;
      }
      iVar1 = 0;
    }
    else {
      iVar1 = -1;
    }
  }
  return iVar1;
}

Assistant:

static int it_mtm_read_sample_data(IT_SAMPLE *sample, DUMBFILE *f)
{
	int32 i;
	int32 truncated_size;

	/* let's get rid of the sample data coming after the end of the loop */
	if ((sample->flags & IT_SAMPLE_LOOP) && sample->loop_end < sample->length) {
		truncated_size = sample->length - sample->loop_end;
		sample->length = sample->loop_end;
	} else {
		truncated_size = 0;
	}

	sample->data = malloc(sample->length);

	if (!sample->data)
		return -1;

	dumbfile_getnc((char *)sample->data, sample->length, f);
	dumbfile_skip(f, truncated_size);

	if (dumbfile_error(f))
		return -1;

	for (i = 0; i < sample->length; i++)
		((signed char *)sample->data)[i] ^= 0x80;

	return 0;
}